

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleStringTest.cpp
# Opt level: O0

void __thiscall TEST_SimpleString_Booleans_Test::testBody(TEST_SimpleString_Booleans_Test *this)

{
  bool bVar1;
  UtestShell *pUVar2;
  TestTerminator *pTVar3;
  SimpleString local_60;
  SimpleString local_50 [2];
  undefined1 local_30 [8];
  SimpleString s2;
  SimpleString s1;
  TEST_SimpleString_Booleans_Test *this_local;
  
  StringFrom((bool)((char)&s2 + '\b'));
  StringFrom(SUB81(local_30,0));
  pUVar2 = UtestShell::getCurrent();
  SimpleString::SimpleString(local_50,"true");
  bVar1 = operator==((SimpleString *)&s2.bufferSize_,local_50);
  pTVar3 = UtestShell::getCurrentTestTerminator();
  (*pUVar2->_vptr_UtestShell[8])
            (pUVar2,(ulong)bVar1,"CHECK","s1 == \"true\"",0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/SimpleStringTest.cpp"
             ,0x256,pTVar3);
  SimpleString::~SimpleString(local_50);
  pUVar2 = UtestShell::getCurrent();
  SimpleString::SimpleString(&local_60,"false");
  bVar1 = operator==((SimpleString *)local_30,&local_60);
  pTVar3 = UtestShell::getCurrentTestTerminator();
  (*pUVar2->_vptr_UtestShell[8])
            (pUVar2,(ulong)bVar1,"CHECK","s2 == \"false\"",0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/SimpleStringTest.cpp"
             ,599,pTVar3);
  SimpleString::~SimpleString(&local_60);
  SimpleString::~SimpleString((SimpleString *)local_30);
  SimpleString::~SimpleString((SimpleString *)&s2.bufferSize_);
  return;
}

Assistant:

TEST(SimpleString, Booleans)
{
    SimpleString s1(StringFrom(true));
    SimpleString s2(StringFrom(false));
    CHECK(s1 == "true");
    CHECK(s2 == "false");
}